

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_287390::CAPIBuildSystemFrontendDelegate::
commandCannotBuildOutputDueToMissingInputs
          (CAPIBuildSystemFrontendDelegate *this,Command *command,Node *outputNode,
          ArrayRef<llbuild::buildsystem::BuildKey> inputKeys)

{
  pointer pcVar1;
  long lVar2;
  StringRef str_00;
  CAPIBuildKey *pCVar3;
  BuildKey *pBVar4;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  Node *extraout_RDX_01;
  iterator __end2;
  size_type __n;
  _Alloc_hider _Var5;
  long lVar6;
  CAPIBuildKey *output;
  string str;
  CAPIBuildKeysVector inputs;
  CAPIBuildKey *local_90;
  char *local_88;
  size_t local_80;
  char local_78;
  undefined7 uStack_77;
  Command *local_68;
  CAPIBuildSystemFrontendDelegate *local_60;
  BuildKey *local_58;
  BuildKey local_50;
  
  __n = inputKeys.Length;
  pBVar4 = inputKeys.Data;
  if ((this->cAPIDelegate).command_cannot_build_output_due_to_missing_inputs !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_build_key_t_ptr_ptr_llb_build_key_t_ptr_ptr_uint64_t
       *)0x0) {
    local_90 = (CAPIBuildKey *)0x0;
    local_68 = command;
    local_60 = this;
    if (outputNode != (Node *)0x0) {
      pcVar1 = (outputNode->name)._M_dataplus._M_p;
      local_88 = &local_78;
      if (pcVar1 == (pointer)0x0) {
        local_80 = 0;
        local_78 = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,pcVar1,pcVar1 + (outputNode->name)._M_string_length);
      }
      pCVar3 = (CAPIBuildKey *)operator_new(0x38);
      str_00.Length = local_80;
      str_00.Data = local_88;
      llbuild::buildsystem::BuildKey::BuildKey(&local_50,'N',str_00);
      CAPIBuildKey::CAPIBuildKey(pCVar3,&local_50);
      outputNode = extraout_RDX;
      local_90 = pCVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.key.key._M_dataplus._M_p != &local_50.key.key.field_2) {
        operator_delete(local_50.key.key._M_dataplus._M_p,
                        local_50.key.key.field_2._M_allocated_capacity + 1);
        outputNode = extraout_RDX_00;
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
        outputNode = extraout_RDX_01;
      }
    }
    std::
    vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
    ::vector((vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
              *)&local_50,__n,(allocator_type *)outputNode);
    _Var5._M_p = local_50.key.key._M_dataplus._M_p;
    if (__n != 0) {
      local_58 = pBVar4 + __n;
      lVar6 = 0;
      do {
        lVar2 = *(long *)((long)&(pBVar4->key).key._M_dataplus._M_p + lVar6 * 4);
        local_88 = &local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_88,lVar2,
                   *(long *)((long)&(pBVar4->key).key._M_string_length + lVar6 * 4) + lVar2);
        pCVar3 = (CAPIBuildKey *)operator_new(0x38);
        CAPIBuildKey::CAPIBuildKey(pCVar3,(BuildKey *)&local_88);
        *(CAPIBuildKey **)(_Var5._M_p + lVar6) = pCVar3;
        if (local_88 != &local_78) {
          operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
        }
        lVar2 = lVar6 * 4;
        lVar6 = lVar6 + 8;
      } while ((BuildKey *)((long)&pBVar4[1].key.key._M_dataplus._M_p + lVar2) != local_58);
    }
    (*(local_60->cAPIDelegate).command_cannot_build_output_due_to_missing_inputs)
              ((local_60->cAPIDelegate).context,(llb_buildsystem_command_t *)local_68,
               (llb_build_key_t **)&local_90,(llb_build_key_t **)local_50.key.key._M_dataplus._M_p,
               (long)(local_50.key.key._M_string_length - (long)local_50.key.key._M_dataplus._M_p)
               >> 3);
    llb_build_key_destroy((llb_build_key_t *)local_90);
    for (_Var5._M_p = local_50.key.key._M_dataplus._M_p;
        (pointer)local_50.key.key._M_string_length != _Var5._M_p; _Var5._M_p = _Var5._M_p + 8) {
      llb_build_key_destroy(*(llb_build_key_t **)_Var5._M_p);
    }
    if ((llb_build_key_t **)local_50.key.key._M_dataplus._M_p != (llb_build_key_t **)0x0) {
      operator_delete(local_50.key.key._M_dataplus._M_p,
                      local_50.key.key.field_2._M_allocated_capacity -
                      (long)local_50.key.key._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

virtual void commandCannotBuildOutputDueToMissingInputs(Command* command,
               Node* outputNode, ArrayRef<BuildKey> inputKeys) override {
    if (cAPIDelegate.command_cannot_build_output_due_to_missing_inputs) {
      CAPIBuildKey *output = nullptr;
      if (outputNode) {
        auto str = outputNode->getName().str();
        output = new CAPIBuildKey(BuildKey::makeNode(str));
      }

      CAPIBuildKeysVector inputs(inputKeys);

      cAPIDelegate.command_cannot_build_output_due_to_missing_inputs(
        cAPIDelegate.context,
        (llb_buildsystem_command_t*) command,
        (llb_build_key_t **)&output,
        inputs.data(),
        inputs.count()
      );

      llb_build_key_destroy((llb_build_key_t *)output);
    }
  }